

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

StartsWithMatcher * Catch::Matchers::StartsWith(string *str,Choice caseSensitivity)

{
  CasedString *in_RDI;
  CasedString *in_stack_ffffffffffffffd8;
  StartsWithMatcher *in_stack_ffffffffffffffe0;
  
  StdString::CasedString::CasedString(in_RDI,(string *)in_RDI,Yes);
  StdString::StartsWithMatcher::StartsWithMatcher
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  StdString::CasedString::~CasedString((CasedString *)0x12d2c1);
  return (StartsWithMatcher *)in_RDI;
}

Assistant:

StdString::StartsWithMatcher StartsWith( std::string const& str, CaseSensitive::Choice caseSensitivity ) {
        return StdString::StartsWithMatcher( StdString::CasedString( str, caseSensitivity) );
    }